

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

int * __thiscall
cornerstone::async_result<int,_std::shared_ptr<std::exception>_>::get
          (async_result<int,_std::shared_ptr<std::exception>_> *this)

{
  bool bVar1;
  undefined8 uVar2;
  shared_ptr<std::exception> *this_00;
  int *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((*(byte *)(in_RDI + 6) & 1) == 0) {
    std::condition_variable::wait((unique_lock *)(in_RDI + 0x1a));
    bVar1 = std::operator==((shared_ptr<std::exception> *)in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8);
    if (!bVar1) {
      this_00 = (shared_ptr<std::exception> *)__cxa_allocate_exception(0x10);
      std::shared_ptr<std::exception>::shared_ptr
                (this_00,(shared_ptr<std::exception> *)in_stack_ffffffffffffffa8);
      __cxa_throw(this_00,&std::shared_ptr<std::exception>::typeinfo,
                  std::shared_ptr<std::exception>::~shared_ptr);
    }
  }
  else {
    bVar1 = std::operator==((shared_ptr<std::exception> *)in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x10);
      std::shared_ptr<std::exception>::shared_ptr
                ((shared_ptr<std::exception> *)in_stack_ffffffffffffffb0,
                 (shared_ptr<std::exception> *)in_stack_ffffffffffffffa8);
      __cxa_throw(uVar2,&std::shared_ptr<std::exception>::typeinfo,
                  std::shared_ptr<std::exception>::~shared_ptr);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

T& get()
    {
        std::unique_lock<std::mutex> lock(lock_);
        if (has_result_)
        {
            if (err_ == nullptr)
            {
                return result_;
            }

            throw err_;
        }

        cv_.wait(lock);
        if (err_ == nullptr)
        {
            return result_;
        }

        throw err_;
    }